

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.h
# Opt level: O2

my_set<unsigned_long> * __thiscall
merlin::my_set<unsigned_long>::operator|
          (my_set<unsigned_long> *__return_storage_ptr__,my_set<unsigned_long> *this,
          unsigned_long *b)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var1;
  value_type_conflict1 local_20;
  
  my_set(__return_storage_ptr__,10);
  local_20 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__return_storage_ptr__,
             ((long)(this->super_my_vector<unsigned_long>).
                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->super_my_vector<unsigned_long>).
                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) + 1,&local_20);
  _Var1 = std::
          __set_union<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long_const*,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    ((this->super_my_vector<unsigned_long>).
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->super_my_vector<unsigned_long>).
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish,b,b + 1,
                     (__return_storage_ptr__->super_my_vector<unsigned_long>).
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start);
  (__return_storage_ptr__->super_my_vector<unsigned_long>).m_n =
       (long)_Var1._M_current -
       (long)(__return_storage_ptr__->super_my_vector<unsigned_long>).
             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  my_vector<unsigned_long>::update(&__return_storage_ptr__->super_my_vector<unsigned_long>);
  return __return_storage_ptr__;
}

Assistant:

my_set<T> my_set<T>::operator|(const T& b) const {
	my_set<T> d;
	size_t n = size();
	d.resize(n + 1);                                // reserve enough space
	typename my_set<T>::iterator dend;
	dend = std::set_union(begin(), end(), &b, (&b) + 1, d._begin()); // use stl set function
	d.m_n = dend - d.begin();
	d.update();
	return d;
}